

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::base_text::base_text(base_text *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_base_text = pp_Var1;
  *(void **)((long)&this->_vptr_base_text + (long)pp_Var1[-3]) = vtt[1];
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  this->low_ = 0;
  this->high_ = -1;
  this->validate_charset_ = true;
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

base_text::base_text() : low_(0),high_(-1),validate_charset_(true)
{
}